

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

BGZF * bgzf_write_init(char *mode)

{
  byte bVar1;
  int iVar2;
  BGZF *pBVar3;
  byte *pbVar4;
  char *pcVar5;
  void *pvVar6;
  z_stream *pzVar7;
  uint uVar8;
  uint uVar9;
  
  pBVar3 = (BGZF *)calloc(1,0x60);
  pbVar4 = (byte *)mode;
  do {
    bVar1 = *pbVar4;
    if (bVar1 == 0) break;
    pbVar4 = pbVar4 + 1;
  } while (9 < (byte)(bVar1 - 0x30));
  pcVar5 = strchr(mode,0x75);
  if ((pcVar5 == (char *)0x0) && (uVar9 = -(uint)(bVar1 == 0) | bVar1 - 0x30, uVar9 != 0xfffffffe))
  {
    pvVar6 = malloc(0x10000);
    pBVar3->uncompressed_block = pvVar6;
    pvVar6 = malloc(0x10000);
    pBVar3->compressed_block = pvVar6;
    uVar8 = 0xffffffff;
    if (-1 < (int)uVar9) {
      uVar8 = uVar9;
    }
    uVar9 = (uVar8 & 0x1ff) * 0x100000;
    *(uint *)pBVar3 = uVar9 + 0x20010000;
    pcVar5 = strchr(mode,0x67);
    if (pcVar5 != (char *)0x0) {
      *(uint *)pBVar3 = uVar9 | 0xa0010000;
      pzVar7 = (z_stream *)calloc(1,0x70);
      pBVar3->gz_stream = pzVar7;
      iVar2 = deflateInit2_(pzVar7,(int)(uVar8 << 0x17) >> 0x17,8,0x1f,8,0,"1.2.11",0x70);
      if (iVar2 != 0) {
        pBVar3 = (BGZF *)0x0;
      }
    }
  }
  else {
    *(int *)pBVar3 = 0x10000;
  }
  return pBVar3;
}

Assistant:

static BGZF *bgzf_write_init(const char *mode)
{
    BGZF *fp;
    fp = (BGZF*)calloc(1, sizeof(BGZF));
    fp->is_write = 1;
    int compress_level = mode2level(mode);
    if ( compress_level==-2 )
    {
        fp->is_compressed = 0;
        return fp;
    }
    fp->is_compressed = 1;
    fp->uncompressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compress_level = compress_level < 0? Z_DEFAULT_COMPRESSION : compress_level; // Z_DEFAULT_COMPRESSION==-1
    if (fp->compress_level > 9) fp->compress_level = Z_DEFAULT_COMPRESSION;
    if ( strchr(mode,'g') )
    {
        // gzip output
        fp->is_gzip = 1;
        fp->gz_stream = (z_stream*)calloc(1,sizeof(z_stream));
        fp->gz_stream->zalloc = NULL;
        fp->gz_stream->zfree  = NULL;
        if ( deflateInit2(fp->gz_stream, fp->compress_level, Z_DEFLATED, 15|16, 8, Z_DEFAULT_STRATEGY)!=Z_OK ) return NULL;
    }
    return fp;
}